

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::TessellationShaderTestInstance::createPipeline
          (TessellationShaderTestInstance *this)

{
  StencilOpState _front;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)16>_> data_03;
  RefData<vk::Handle<(vk::HandleType)18>_> data_04;
  StencilOpState _back;
  DeviceInterface *deviceInterface;
  VkAllocationCallbacks *pVVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  ProgramBinary *pPVar3;
  Handle<(vk::HandleType)16> *pHVar4;
  Handle<(vk::HandleType)17> *pHVar5;
  Handle<(vk::HandleType)14> *pHVar6;
  VkPipelineCache local_a50;
  Move<vk::Handle<(vk::HandleType)18>_> local_a48;
  RefData<vk::Handle<(vk::HandleType)18>_> local_a28;
  allocator<unsigned_int> local_a05;
  value_type_conflict2 local_a04;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a00;
  MultiSampleState local_9e8;
  VkPipelineRasterizationStateCreateInfo local_9a0;
  VkStencilOpState local_960;
  VkStencilOpState local_940;
  VkPipelineDepthStencilStateCreateInfo local_920;
  allocator<vk::VkRect2D> local_8b1;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_8b0;
  allocator<vk::VkViewport> local_891;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_890;
  ViewportState local_878;
  undefined1 auStack_818 [8];
  VkRect2D scissor;
  VkViewport viewport;
  ColorBlendState local_7e8;
  VkPipelineInputAssemblyStateCreateInfo local_798;
  VkPipelineTessellationStateCreateInfo local_778;
  deUint64 local_760;
  VkPipelineShaderStageCreateInfo local_758;
  deUint64 local_728;
  VkPipelineShaderStageCreateInfo local_720;
  deUint64 local_6f0;
  VkPipelineShaderStageCreateInfo local_6e8;
  deUint64 local_6b8;
  VkPipelineShaderStageCreateInfo local_6b0;
  deUint64 local_680;
  VkPipelineLayout local_678;
  undefined1 local_670 [8];
  PipelineCreateInfo pipelineCreateInfo;
  VkPipelineVertexInputStateCreateInfo vf_info;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkVertexInputBindingDescription vertexInputBindingDescription;
  RefData<vk::Handle<(vk::HandleType)16>_> local_308;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_2e8
  ;
  undefined1 local_2d0 [8];
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  Attachment attachmentState;
  Move<vk::Handle<(vk::HandleType)14>_> local_228;
  RefData<vk::Handle<(vk::HandleType)14>_> local_208;
  undefined1 local_1e8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fs;
  string local_1c0;
  Move<vk::Handle<(vk::HandleType)14>_> local_1a0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_180;
  undefined1 local_160 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> te;
  string local_138;
  Move<vk::Handle<(vk::HandleType)14>_> local_118;
  RefData<vk::Handle<(vk::HandleType)14>_> local_f8;
  undefined1 local_d8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> tc;
  allocator<char> local_a1;
  string local_a0;
  Move<vk::Handle<(vk::HandleType)14>_> local_80;
  RefData<vk::Handle<(vk::HandleType)14>_> local_60;
  undefined1 local_40 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vs;
  VkDevice device;
  DeviceInterface *vk;
  TessellationShaderTestInstance *this_local;
  
  deviceInterface =
       Context::getDeviceInterface
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  pVVar1 = (VkAllocationCallbacks *)
           Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator = pVVar1;
  pPVar2 = Context::getBinaryCollection
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"vertex",&local_a1);
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_a0);
  ::vk::createShaderModule(&local_80,deviceInterface,(VkDevice)pVVar1,pPVar3,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_60,(Move *)&local_80);
  data.deleter.m_deviceIface._0_4_ = (int)local_60.deleter.m_deviceIface;
  data.object.m_internal = local_60.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_60.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_60.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_60.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_60.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_60.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_40,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pVVar1 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pPVar2 = Context::getBinaryCollection
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"tessellation_control",
             (allocator<char> *)
             ((long)&te.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator +
             7));
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_138);
  ::vk::createShaderModule(&local_118,deviceInterface,(VkDevice)pVVar1,pPVar3,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f8,(Move *)&local_118);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_f8.deleter.m_deviceIface;
  data_00.object.m_internal = local_f8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_f8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_f8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_f8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_d8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&te.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator +
             7));
  pVVar1 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pPVar2 = Context::getBinaryCollection
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"tessellation_evaluation",
             (allocator<char> *)
             ((long)&fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator +
             7));
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_1c0);
  ::vk::createShaderModule(&local_1a0,deviceInterface,(VkDevice)pVVar1,pPVar3,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_180,(Move *)&local_1a0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_180.deleter.m_deviceIface;
  data_01.object.m_internal = local_180.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_180.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_180.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_180.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_180.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_180.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_160,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator +
             7));
  pVVar1 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pPVar2 = Context::getBinaryCollection
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attachmentState.super_VkPipelineColorBlendAttachmentState.colorWriteMask,
             "fragment",
             (allocator<char> *)
             ((long)&attachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp + 3));
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar2,(string *)
                             &attachmentState.super_VkPipelineColorBlendAttachmentState.
                              colorWriteMask);
  ::vk::createShaderModule(&local_228,deviceInterface,(VkDevice)pVVar1,pPVar3,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_208,(Move *)&local_228);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_208.deleter.m_deviceIface;
  data_02.object.m_internal = local_208.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_208.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_208.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_208.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_208.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_208.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_1e8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_228);
  std::__cxx11::string::~string
            ((string *)&attachmentState.super_VkPipelineColorBlendAttachmentState.colorWriteMask);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&attachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp + 3));
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)
             ((long)&pipelineLayoutCreateInfo.m_pushConstantRanges.
                     super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  local_2e8.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&local_2e8);
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            ((PipelineLayoutCreateInfo *)local_2d0,&local_2e8,0,(VkPushConstantRange *)0x0);
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~vector(&local_2e8);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&vertexInputBindingDescription.inputRate,
             deviceInterface,
             (VkDevice)vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,
             (VkPipelineLayoutCreateInfo *)local_2d0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_308,(Move *)&vertexInputBindingDescription.inputRate);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_308.deleter.m_deviceIface;
  data_03.object.m_internal = local_308.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_308.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_308.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_308.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_308.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_308.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&(this->super_GraphicBasicTestInstance).m_pipelineLayout,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&vertexInputBindingDescription.inputRate);
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[1].offset = 0x20;
  vertexInputBindingDescription.binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R4G4_UNORM_PACK8;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0x6d;
  vertexInputAttributeDescriptions[1].binding = 0x10;
  vf_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vertexInputAttributeDescriptions[0].location = 0x6d;
  vertexInputAttributeDescriptions[0].binding = 0;
  pipelineCreateInfo.m_multisampleStateSampleMask.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x13;
  vf_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vf_info._4_4_ = 0;
  vf_info.pNext._0_4_ = 0;
  vf_info.pNext._4_4_ = 1;
  vf_info._16_8_ = &vertexInputAttributeDescriptions[1].format;
  vf_info.pVertexBindingDescriptions._0_4_ = 2;
  vf_info._32_8_ = &vf_info.pVertexAttributeDescriptions;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->super_GraphicBasicTestInstance).m_pipelineLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_678.m_internal = pHVar4->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->super_GraphicBasicTestInstance).m_renderPass.
                       super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_680 = pHVar5->m_internal;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)local_670,local_678,(VkRenderPass)local_680,0,0);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_40);
  local_6b8 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_6b0,(VkShaderModule)local_6b8,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_670,&local_6b0);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_d8);
  local_6f0 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_6e8,(VkShaderModule)local_6f0,"main",
             VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_670,&local_6e8);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_160);
  local_728 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_720,(VkShaderModule)local_728,"main",
             VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_670,&local_720);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_1e8);
  local_760 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_758,(VkShaderModule)local_760,"main",
             VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_670,&local_758);
  Draw::PipelineCreateInfo::TessellationState::TessellationState((TessellationState *)&local_778,4);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_670,&local_778);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_798,VK_PRIMITIVE_TOPOLOGY_PATCH_LIST,0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_670,&local_798);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            (&local_7e8,1,
             (VkPipelineColorBlendAttachmentState *)
             ((long)&pipelineLayoutCreateInfo.m_pushConstantRanges.
                     super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_670,&local_7e8.super_VkPipelineColorBlendStateCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::~ColorBlendState(&local_7e8);
  scissor.extent.width = 0;
  scissor.extent.height = 0;
  auStack_818._0_4_ = 0;
  auStack_818._4_4_ = 0;
  scissor.offset.x = 0x40;
  scissor.offset.y = 0x40;
  std::allocator<vk::VkViewport>::allocator(&local_891);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            (&local_890,1,(value_type *)&scissor.extent,&local_891);
  std::allocator<vk::VkRect2D>::allocator(&local_8b1);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector
            (&local_8b0,1,(value_type *)auStack_818,&local_8b1);
  Draw::PipelineCreateInfo::ViewportState::ViewportState(&local_878,1,&local_890,&local_8b0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_670,&local_878.super_VkPipelineViewportStateCreateInfo);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState(&local_878);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_8b0);
  std::allocator<vk::VkRect2D>::~allocator(&local_8b1);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_890);
  std::allocator<vk::VkViewport>::~allocator(&local_891);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_940,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_960,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_940.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_940.failOp;
  _front.super_VkStencilOpState.passOp = local_940.passOp;
  _front.super_VkStencilOpState.compareOp = local_940.compareOp;
  _front.super_VkStencilOpState.compareMask = local_940.compareMask;
  _front.super_VkStencilOpState.writeMask = local_940.writeMask;
  _front.super_VkStencilOpState.reference = local_940.reference;
  _back.super_VkStencilOpState.depthFailOp = local_960.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_960.failOp;
  _back.super_VkStencilOpState.passOp = local_960.passOp;
  _back.super_VkStencilOpState.compareOp = local_960.compareOp;
  _back.super_VkStencilOpState.compareMask = local_960.compareMask;
  _back.super_VkStencilOpState.writeMask = local_960.writeMask;
  _back.super_VkStencilOpState.reference = local_960.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&local_920,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_670,&local_920);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_9a0,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_670,&local_9a0);
  local_a04 = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_a05);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_a00,1,&local_a04,&local_a05);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            (&local_9e8,VK_SAMPLE_COUNT_1_BIT,0,0.0,&local_a00,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_670,&local_9e8.super_VkPipelineMultisampleStateCreateInfo);
  Draw::PipelineCreateInfo::MultiSampleState::~MultiSampleState(&local_9e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a00);
  std::allocator<unsigned_int>::~allocator(&local_a05);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_670,
             (VkPipelineVertexInputStateCreateInfo *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pVVar1 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_a50,0);
  ::vk::createGraphicsPipeline
            (&local_a48,deviceInterface,(VkDevice)pVVar1,local_a50,
             (VkGraphicsPipelineCreateInfo *)local_670,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a28,(Move *)&local_a48);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_a28.deleter.m_deviceIface;
  data_04.object.m_internal = local_a28.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a28.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_a28.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_a28.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_a28.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_a28.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            (&(this->super_GraphicBasicTestInstance).m_pipeline,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_a48);
  Draw::PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)local_670);
  Draw::PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo((PipelineLayoutCreateInfo *)local_2d0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_1e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_160);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_40);
  return;
}

Assistant:

void TessellationShaderTestInstance::createPipeline (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	// Pipeline
	Unique<VkShaderModule> vs(createShaderModule(vk, device, m_context.getBinaryCollection().get("vertex"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> tc(createShaderModule(vk, device, m_context.getBinaryCollection().get("tessellation_control"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> te(createShaderModule(vk, device, m_context.getBinaryCollection().get("tessellation_evaluation"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> fs(createShaderModule(vk, device, m_context.getBinaryCollection().get("fragment"), (VkShaderModuleCreateFlags)0));

	const PipelineCreateInfo::ColorBlendState::Attachment attachmentState;

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout = createPipelineLayout(vk, device, &pipelineLayoutCreateInfo);

	const VkVertexInputBindingDescription vertexInputBindingDescription		=
	{
		0u,											// binding;
		static_cast<deUint32>(sizeof(VertexData)),	// stride;
		VK_VERTEX_INPUT_RATE_VERTEX					// inputRate
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,
			0u,
			VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},	// VertexElementData::position
		{
			1u,
			0u,
			VK_FORMAT_R32G32B32A32_SFLOAT,
			static_cast<deUint32>(sizeof(tcu::Vec4))
		},	// VertexElementData::color
	};

	const VkPipelineVertexInputStateCreateInfo vf_info			=
	{																	// sType;
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// pNext;
		NULL,															// flags;
		0u,																// vertexBindingDescriptionCount;
		1u,																// pVertexBindingDescriptions;
		&vertexInputBindingDescription,									// vertexAttributeDescriptionCount;
		2u,																// pVertexAttributeDescriptions;
		vertexInputAttributeDescriptions
	};

	PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, (VkPipelineCreateFlags)0);
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", VK_SHADER_STAGE_VERTEX_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*tc, "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*te, "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", VK_SHADER_STAGE_FRAGMENT_BIT));
	pipelineCreateInfo.addState	(PipelineCreateInfo::TessellationState(4));
	pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(VK_PRIMITIVE_TOPOLOGY_PATCH_LIST));
	pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &attachmentState));

	const VkViewport	viewport	=
	{
		0.0f,		// float x;
		0.0f,		// float y;
		WIDTH,	// float width;
		HEIGHT,	// float height;
		0.0f,	// float minDepth;
		1.0f	// float maxDepth;
	};

	const VkRect2D		scissor		=
	{
		{
			0,		// deInt32 x
			0,		// deInt32 y
		},		// VkOffset2D	offset;
		{
			WIDTH,	// deInt32 width;
			HEIGHT,	// deInt32 height
		},		// VkExtent2D	extent;
	};
	pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<VkViewport>(1, viewport), std::vector<VkRect2D>(1, scissor)));
	pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());
	pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
	pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
	pipelineCreateInfo.addState(vf_info);
	m_pipeline = createGraphicsPipeline(vk, device, DE_NULL, &pipelineCreateInfo);
}